

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardgestures.cpp
# Opt level: O0

QPointF panOffset(QList<QEventPoint> *touchPoints,int maxCount)

{
  int iVar1;
  Promoted<long_long,_int> PVar2;
  QList<QEventPoint> *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar3;
  int p;
  int count;
  QPointF result;
  qsizetype in_stack_ffffffffffffff78;
  QPointF *in_stack_ffffffffffffff80;
  int iVar4;
  QPointF local_38;
  qsizetype local_28;
  QPointF local_20;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.xp = -NAN;
  local_20.yp = -NAN;
  QPointF::QPointF(&local_20);
  local_28 = QList<QEventPoint>::size(in_RDI);
  PVar2 = qMin<long_long,int>(&local_28,&local_c);
  iVar1 = (int)PVar2;
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    QList<QEventPoint>::at
              ((QList<QEventPoint> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QEventPoint::position();
    QList<QEventPoint>::at
              ((QList<QEventPoint> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QEventPoint::pressPosition();
    local_38 = operator-((QPointF *)CONCAT44(iVar1,iVar4),in_stack_ffffffffffffff80);
    QPointF::operator+=(&local_20,&local_38);
  }
  QVar3 = operator/((QPointF *)CONCAT44(iVar1,iVar4),(qreal)in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

static QPointF panOffset(const QList<QEventPoint> &touchPoints, int maxCount)
{
    QPointF result;
    const int count = qMin(touchPoints.size(), maxCount);
    for (int p = 0; p < count; ++p)
        result += touchPoints.at(p).position() - touchPoints.at(p).pressPosition();
    return result / qreal(count);
}